

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg const_gc(FuncState *fs,GCobj *gc,uint32_t itype)

{
  TValue *pTVar1;
  TValue TVar2;
  TValue *o;
  TValue key;
  lua_State *L;
  GCobj *pGStack_68;
  uint32_t itype_local;
  GCobj *gc_local;
  FuncState *fs_local;
  GCobj *local_50;
  TValue **local_48;
  TValue local_40;
  uint32_t local_34;
  GCobj *local_30;
  TValue **local_28;
  char *local_20;
  TValue **local_18;
  TValue local_10;
  
  key = (TValue)fs->L;
  local_48 = &o;
  o = (TValue *)((ulong)gc | (ulong)itype << 0x2f);
  local_20 = "store to dead GC object";
  L._4_4_ = itype;
  pGStack_68 = gc;
  gc_local = (GCobj *)fs;
  fs_local._4_4_ = itype;
  local_50 = gc;
  local_40 = key;
  local_34 = itype;
  local_30 = gc;
  local_28 = local_48;
  local_18 = local_48;
  local_10 = key;
  pTVar1 = lj_tab_set((lua_State *)key,fs->kt,(cTValue *)&o);
  if ((pTVar1->field_4).it == 0) {
    fs_local._0_4_ = (pTVar1->u32).lo;
  }
  else {
    TVar2.field_4.it = 0;
    TVar2.field_4.i = (uint)(gc_local->th).openupval.gcptr64;
    *pTVar1 = TVar2;
    fs_local._0_4_ = (BCReg)(gc_local->th).openupval.gcptr64;
    *(BCReg *)&(gc_local->th).openupval.gcptr64 = (BCReg)fs_local + 1;
  }
  return (BCReg)fs_local;
}

Assistant:

static BCReg const_gc(FuncState *fs, GCobj *gc, uint32_t itype)
{
  lua_State *L = fs->L;
  TValue key, *o;
  setgcV(L, &key, gc, itype);
  /* NOBARRIER: the key is new or kept alive. */
  o = lj_tab_set(L, fs->kt, &key);
  if (tvhaskslot(o))
    return tvkslot(o);
  o->u64 = fs->nkgc;
  return fs->nkgc++;
}